

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall
Timer::addTimer(Timer *this,TimerListener *listener,uint32_t msecs,uint32_t private_data)

{
  undefined1 local_68 [8];
  TimerNode timer;
  undefined1 local_38 [4];
  uint32_t ticks;
  AutoLock _auto_lock_;
  uint32_t private_data_local;
  uint32_t msecs_local;
  TimerListener *listener_local;
  Timer *this_local;
  
  _auto_lock_.mLine = private_data;
  _auto_lock_._20_4_ = msecs;
  AutoLock::AutoLock((AutoLock *)local_38,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xf8);
  if (listener == (TimerListener *)0x0) {
    abort();
  }
  timer.mRemainingMS = (uint)(_auto_lock_._20_4_ + -1 + this->mMsPerTick) / (uint)this->mMsPerTick;
  TimerNode::TimerNode((TimerNode *)local_68);
  SmartPtr<Event>::operator=((SmartPtr<Event> *)local_68,(Event *)0x0);
  timer.mEvent.mObj = (Event *)0x0;
  timer.mListener._0_4_ = _auto_lock_.mLine;
  timer.mListener._4_4_ = this->mTicks + timer.mRemainingMS;
  timer.mPrivateData = 0;
  timer.mTick = 0;
  timer.mDispatcher = (IEventDispatcher *)listener;
  addTimerNode(this,(TimerNode *)local_68);
  TimerNode::~TimerNode((TimerNode *)local_68);
  AutoLock::~AutoLock((AutoLock *)local_38);
  return;
}

Assistant:

void Timer::addTimer( TimerListener *listener,
					  uint32_t msecs,
					  uint32_t private_data )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );

	if (listener == NULL) abort();

	// Calculate the timeout time in ticks
	uint32_t ticks = ( msecs +  mMsPerTick - 1 ) / mMsPerTick;
	
	// Initialize new timer node
	TimerNode timer;
	timer.mEvent = NULL;
	timer.mDispatcher = NULL;
	timer.mPrivateData = private_data;
	timer.mListener = listener;
	timer.mTick = mTicks + ticks;
	timer.mRepeatMS = 0;
	timer.mRemainingMS = 0;	

	LOG( "timer at %d ticks", timer.mTick );

	addTimerNode( timer );
}